

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardSubsumptionDemodulation.cpp
# Opt level: O2

bool __thiscall
Inferences::BackwardSubsumptionDemodulation::simplifyCandidate
          (BackwardSubsumptionDemodulation *this,Clause *sideCl,Clause *mainCl,
          vector<Inferences::BwSimplificationRecord,_std::allocator<Inferences::BwSimplificationRecord>_>
          *simplifications)

{
  Literal *base;
  Literal *instance;
  Clause *pCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint bi;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint local_64;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_BackwardSubsumptionDemodulation_cpp:309:5)>
  on_scope_exit_guard_on_line_313;
  Clause *mainCl_local;
  BackwardSubsumptionDemodulation *local_50;
  Clause *local_48;
  Clause *replacement;
  vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>
  *local_38;
  
  mainCl_local = mainCl;
  local_50 = this;
  local_38 = (vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>
              *)simplifications;
  if ((simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
       ::alts == '\0') &&
     (iVar3 = __cxa_guard_acquire(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                                   ::alts), iVar3 != 0)) {
    simplifyCandidate::alts.
    super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    simplifyCandidate::alts.
    super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    simplifyCandidate::alts.
    super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::
                 vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
                 ::~vector,&simplifyCandidate::alts,&__dso_handle);
    __cxa_guard_release(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                         ::alts);
  }
  if (simplifyCandidate::alts.
      super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      simplifyCandidate::alts.
      super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    simplifyCandidate::alts.
    super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         simplifyCandidate::alts.
         super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  on_scope_exit_guard_on_line_313.active = false;
  on_scope_exit_guard_on_line_313._1_3_ = 0;
  on_scope_exit_guard_on_line_313.exception_count = 0;
  std::vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>::
  resize(&simplifyCandidate::alts,(ulong)((uint)*(undefined8 *)&sideCl->field_0x38 & 0xfffff),
         (value_type *)&on_scope_exit_guard_on_line_313);
  local_64 = 0;
  local_48 = sideCl;
  for (uVar5 = 0; pCVar1 = mainCl_local,
      uVar5 < ((uint)*(undefined8 *)&local_48->field_0x38 & 0xfffff); uVar5 = uVar5 + 1) {
    base = local_48->_literals[uVar5];
    for (uVar6 = 0; uVar6 < ((uint)*(undefined8 *)&pCVar1->field_0x38 & 0xfffff); uVar6 = uVar6 + 1)
    {
      instance = pCVar1->_literals[uVar6];
      bVar2 = Kernel::MatchingUtils::match(base,instance,false);
      if (bVar2) {
        Lib::List<Kernel::Literal_*>::push
                  (instance,simplifyCandidate::alts.
                            super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar5);
      }
    }
    if (simplifyCandidate::alts.
        super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar5] == (List<Kernel::Literal_*> *)0x0) {
      if (local_64 != 0) {
        on_scope_exit_guard_on_line_313.active = true;
        iVar3 = std::uncaught_exceptions();
        on_scope_exit_guard_on_line_313.exception_count = iVar3;
        goto LAB_003d5b23;
      }
      if (((base->super_Term)._functor != 0) ||
         (local_64 = 1, ((base->super_Term)._args[0]._content & 4) == 0)) {
        local_64 = 2;
        break;
      }
    }
  }
  pCVar1 = local_48;
  on_scope_exit_guard_on_line_313.active = true;
  iVar3 = std::uncaught_exceptions();
  on_scope_exit_guard_on_line_313.exception_count = iVar3;
  if (local_64 < 2) {
    if ((simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
         ::matcher == '\0') &&
       (iVar3 = __cxa_guard_acquire(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                                     ::matcher), iVar3 != 0)) {
      Kernel::MLMatcherSD::MLMatcherSD(&simplifyCandidate::matcher);
      __cxa_atexit(Kernel::MLMatcherSD::~MLMatcherSD,&simplifyCandidate::matcher,&__dso_handle);
      __cxa_guard_release(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                           ::matcher);
    }
    Kernel::MLMatcherSD::init(&simplifyCandidate::matcher,(EVP_PKEY_CTX *)pCVar1);
    if ((simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
         ::maxMatches == '\0') &&
       (iVar3 = __cxa_guard_acquire(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                                     ::maxMatches), iVar3 != 0)) {
      iVar3 = (*(local_50->super_BackwardSimplificationEngine).super_InferenceEngine.
                _vptr_InferenceEngine[4])();
      if (*(int *)(CONCAT44(extraout_var,iVar3) + 0x1c68) == 0) {
        simplifyCandidate::maxMatches = 0xffffffff;
      }
      else {
        iVar3 = (*(local_50->super_BackwardSimplificationEngine).super_InferenceEngine.
                  _vptr_InferenceEngine[4])();
        simplifyCandidate::maxMatches = *(uint *)(CONCAT44(extraout_var_00,iVar3) + 0x1c68);
      }
      __cxa_guard_release(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                           ::maxMatches);
    }
    uVar4 = 0;
    while ((uVar4 < simplifyCandidate::maxMatches &&
           (bVar2 = Kernel::MLMatcherSD::nextMatch(&simplifyCandidate::matcher), bVar2))) {
      replacement = (Clause *)0x0;
      bVar2 = rewriteCandidate(local_50,pCVar1,mainCl_local,&simplifyCandidate::matcher,&replacement
                              );
      if (bVar2) {
        std::
        vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>
        ::emplace_back<Kernel::Clause*&,Kernel::Clause*&>(local_38,&mainCl_local,&replacement);
        bVar2 = true;
        goto LAB_003d5b25;
      }
      uVar4 = uVar4 + 1;
    }
  }
LAB_003d5b23:
  bVar2 = false;
LAB_003d5b25:
  Lib::
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/BackwardSubsumptionDemodulation.cpp:309:5)>
  ::~ScopeGuard(&on_scope_exit_guard_on_line_313);
  return bVar2;
}

Assistant:

bool BackwardSubsumptionDemodulation::simplifyCandidate(Clause* sideCl, Clause* mainCl, std::vector<BwSimplificationRecord>& simplifications)
{
    static std::vector<LiteralList*> alts;

    alts.clear();
    alts.resize(sideCl->length(), LiteralList::empty());

    unsigned baseLitsWithoutAlternatives = 0;
    for (unsigned bi = 0; bi < sideCl->length(); ++bi) {
      Literal* baseLit = (*sideCl)[bi];

      for (unsigned ii = 0; ii < mainCl->length(); ++ii) {
        Literal* instLit = (*mainCl)[ii];
        if (MatchingUtils::match(baseLit, instLit, false)) {
          LiteralList::push(instLit, alts[bi]);
        }
      }  // for(ii)

      if (LiteralList::isEmpty(alts[bi])) {
        // baseLit does not have any suitable alternative at all!
        //
        // If there are base literals without any suitable alternatives:
        // 1. If there is only one literal without alternative and it is a positive equality,
        //    then it might still be possible to get an SD inference by choosing this literal
        //    as equality for demodulation.
        // 2. If there is a literal without alternative but it is not a positive equality,
        //    then it is impossible to get an SD inference.
        // 3. If there are two literals without alternatives, then it is impossible as well.
        //
        // (This check exists purely for performance reasons.
        // MLMatcher would exclude cases 2 and 3 as well, but with additional overhead.)
        baseLitsWithoutAlternatives += 1;
        if (baseLitsWithoutAlternatives == 1) {
          if (!baseLit->isEquality() || !baseLit->isPositive()) {
            // We are in case 2 => skip
            baseLitsWithoutAlternatives += 1;  // a hack so we don't need another variable to check whether to skip below (in other words, merge case 2 into case 3 for purpose of the "if" below)
            break;
          }
        } else {
          // We are in case 3 => skip
          ASS_G(baseLitsWithoutAlternatives, 1);
          break;
        }
      }
    }  // for(bi)

    // Ensure cleanup of LiteralLists
    ON_SCOPE_EXIT({
      for (LiteralList* ll : alts) {
        LiteralList::destroy(ll);
      }
    });

    // Skip due to missing alternatives? (see comment above, "baseLit does not have any suitable alternative")
    if (baseLitsWithoutAlternatives > 1) {
      RSTAT_CTR_INC("BSD, skipped candidate main premise due to baseLitsWithoutAlternatives");
      return false;
    }

    ASS_LE(baseLitsWithoutAlternatives, 1);
    ASS_EQ(sideCl->length(), alts.size());

    static MLMatcherSD matcher;
    matcher.init(sideCl, mainCl, alts.data());

    static unsigned const maxMatches =
      getOptions().backwardSubsumptionDemodulationMaxMatches() == 0
      ? std::numeric_limits<decltype(maxMatches)>::max()
      : getOptions().backwardSubsumptionDemodulationMaxMatches();

    unsigned numMatches = 0;
    for (; numMatches < maxMatches; ++numMatches) {
      if (!matcher.nextMatch()) {
        break;
      }

      Clause* replacement = nullptr;
      if (rewriteCandidate(sideCl, mainCl, matcher, replacement)) {
        RSTAT_MCTR_INC("BSD, successes by MLMatch", numMatches + 1);  // +1 so it fits with the previous output
        simplifications.emplace_back(mainCl, replacement);
        return true;
      }
    }  // for (numMatches)

    if (numMatches > 0) {
      RSTAT_CTR_INC("BSD, MLMatch but no subsumption demodulation");
    }

    return false;
}